

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

int dict_free(dict_t *d)

{
  int iVar1;
  dictword_t *ptr;
  void *pvVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if (d != (dict_t *)0x0) {
    iVar1 = d->refcnt;
    iVar3 = iVar1 + -1;
    d->refcnt = iVar3;
    if (iVar1 < 2) {
      lVar5 = 8;
      for (lVar4 = 0; ptr = d->word, lVar4 < d->n_word; lVar4 = lVar4 + 1) {
        pvVar2 = *(void **)((long)ptr + lVar5 + -8);
        if (pvVar2 != (void *)0x0) {
          ckd_free(pvVar2);
        }
        pvVar2 = *(void **)((long)&ptr->word + lVar5);
        if (pvVar2 != (void *)0x0) {
          ckd_free(pvVar2);
        }
        lVar5 = lVar5 + 0x20;
      }
      if (ptr != (dictword_t *)0x0) {
        ckd_free(ptr);
      }
      if (d->ht != (hash_table_t *)0x0) {
        hash_table_free(d->ht);
      }
      if (d->mdef != (bin_mdef_t *)0x0) {
        bin_mdef_free(d->mdef);
      }
      ckd_free(d);
      iVar3 = 0;
    }
    return iVar3;
  }
  return 0;
}

Assistant:

int
dict_free(dict_t * d)
{
    int i;
    dictword_t *word;

    if (d == NULL)
        return 0;
    if (--d->refcnt > 0)
        return d->refcnt;

    /* First Step, free all memory allocated for each word */
    for (i = 0; i < d->n_word; i++) {
        word = (dictword_t *) & (d->word[i]);
        if (word->word)
            ckd_free((void *) word->word);
        if (word->ciphone)
            ckd_free((void *) word->ciphone);
    }

    if (d->word)
        ckd_free((void *) d->word);
    if (d->ht)
        hash_table_free(d->ht);
    if (d->mdef)
        bin_mdef_free(d->mdef);
    ckd_free((void *) d);

    return 0;
}